

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jctrans.c
# Opt level: O0

void transencode_coef_controller(j_compress_ptr cinfo,jvirt_barray_ptr *coef_arrays)

{
  undefined8 *puVar1;
  void *target;
  undefined8 in_RSI;
  long in_RDI;
  int i;
  JBLOCKROW buffer;
  my_coef_ptr coef;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  
  puVar1 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x78);
  *(undefined8 **)(in_RDI + 0x1c8) = puVar1;
  *puVar1 = start_pass_coef;
  puVar1[1] = compress_output;
  puVar1[4] = in_RSI;
  target = (void *)(**(code **)(*(long *)(in_RDI + 8) + 8))(in_RDI,1,0x500);
  jzero_far(target,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  for (iVar2 = 0; iVar2 < 10; iVar2 = iVar2 + 1) {
    puVar1[(long)iVar2 + 5] = (void *)((long)target + (long)iVar2 * 0x80);
  }
  return;
}

Assistant:

LOCAL(void)
transencode_coef_controller(j_compress_ptr cinfo,
                            jvirt_barray_ptr *coef_arrays)
{
  my_coef_ptr coef;
  JBLOCKROW buffer;
  int i;

  coef = (my_coef_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_coef_controller));
  cinfo->coef = (struct jpeg_c_coef_controller *)coef;
  coef->pub.start_pass = start_pass_coef;
  coef->pub.compress_data = compress_output;

  /* Save pointer to virtual arrays */
  coef->whole_image = coef_arrays;

  /* Allocate and pre-zero space for dummy DCT blocks. */
  buffer = (JBLOCKROW)
    (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                C_MAX_BLOCKS_IN_MCU * sizeof(JBLOCK));
  jzero_far((void *)buffer, C_MAX_BLOCKS_IN_MCU * sizeof(JBLOCK));
  for (i = 0; i < C_MAX_BLOCKS_IN_MCU; i++) {
    coef->dummy_buffer[i] = buffer + i;
  }
}